

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O3

QLayoutItem * __thiscall
QLayout::replaceWidget(QLayout *this,QWidget *from,QWidget *to,FindChildOptions options)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  QWidget *pQVar5;
  long lVar6;
  QLayoutItem *pQVar7;
  QLayoutItem *pQVar8;
  
  if (((from != to) && (from != (QWidget *)0x0)) && (to != (QWidget *)0x0)) {
    plVar1 = *(long **)&this->field_0x8;
    iVar2 = (**(code **)(*(long *)this + 200))();
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        plVar4 = (long *)(**(code **)(*(long *)this + 0xa8))(this,iVar2);
        if (plVar4 != (long *)0x0) {
          pQVar5 = (QWidget *)(**(code **)(*plVar4 + 0x68))(plVar4);
          if (pQVar5 == from) {
            addChildWidget(this,to);
            pQVar7 = (QLayoutItem *)operator_new(0x18);
            (pQVar7->align).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
            pQVar7->_vptr_QLayoutItem = (_func_int **)&PTR__QWidgetItem_007e6f58;
            pQVar7[1]._vptr_QLayoutItem = (_func_int **)to;
            QLayoutItem::setAlignment
                      (pQVar7,(QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                              ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)(plVar4 + 1))->
                              super_QFlagsStorage<Qt::AlignmentFlag>);
            pQVar8 = (QLayoutItem *)(**(code **)(*plVar1 + 0x20))(plVar1,iVar2,pQVar7);
            if (pQVar8 == (QLayoutItem *)0x0) {
              (*pQVar7->_vptr_QLayoutItem[1])(pQVar7);
              return (QLayoutItem *)0x0;
            }
            return pQVar8;
          }
          lVar6 = (**(code **)(*plVar4 + 0x70))(plVar4);
          if (lVar6 != 0 &&
              ((uint)options.super_QFlagsStorageHelper<Qt::FindChildOption,_4>.
                     super_QFlagsStorage<Qt::FindChildOption>.i & 1) != 0) {
            plVar4 = (long *)(**(code **)(*plVar4 + 0x70))(plVar4);
            pQVar7 = (QLayoutItem *)(**(code **)(*plVar4 + 0xe0))(plVar4,from,to);
            if (pQVar7 != (QLayoutItem *)0x0) {
              return pQVar7;
            }
          }
        }
        iVar2 = iVar2 + 1;
        iVar3 = (**(code **)(*(long *)this + 200))(this);
      } while (iVar2 < iVar3);
    }
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *QLayout::replaceWidget(QWidget *from, QWidget *to, Qt::FindChildOptions options)
{
    Q_D(QLayout);
    if (!from || !to)
        return nullptr;
    if (from == to)     // Do not return a QLayoutItem for \a from, since ownership still
        return nullptr; // belongs to the layout (since nothing was changed)

    int index = -1;
    QLayoutItem *item = nullptr;
    for (int u = 0; u < count(); ++u) {
        item = itemAt(u);
        if (!item)
            continue;

        if (item->widget() == from) {
            index = u;
            break;
        }

        if (item->layout() && (options & Qt::FindChildrenRecursively)) {
            QLayoutItem *r = item->layout()->replaceWidget(from, to, options);
            if (r)
                return r;
        }
    }
    if (index == -1)
        return nullptr;

    addChildWidget(to);
    QLayoutItem *newitem = new QWidgetItem(to);
    newitem->setAlignment(item->alignment());
    QLayoutItem *r = d->replaceAt(index, newitem);
    if (!r)
        delete newitem;
    return r;
}